

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

CM_RETURN_STATUS __thiscall
ConfusableMatcher::CheckWordBoundary(ConfusableMatcher *this,CMStringView In,CMStringView Match)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  CMStringView local_98;
  char *local_88;
  char *local_80;
  unsigned_long local_78;
  unsigned_long distToEnd;
  size_t matchEnd;
  unsigned_long local_58 [2];
  size_type local_48;
  unsigned_long distToStart;
  bool endPass;
  ConfusableMatcher *pCStack_38;
  bool startPass;
  ConfusableMatcher *this_local;
  CMStringView Match_local;
  CMStringView In_local;
  
  Match_local._M_len = (size_t)Match._M_str;
  this_local = (ConfusableMatcher *)Match._M_len;
  Match_local._M_str = (char *)In._M_len;
  distToStart._7_1_ = 0;
  distToStart._6_1_ = 0;
  pCStack_38 = this;
  pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
           data((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
  pcVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
           data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (pcVar1 == pcVar2) {
    distToStart._7_1_ = true;
  }
  else {
    local_58[1] = 4;
    pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pcVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             data((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
    local_58[0] = (long)pcVar1 - (long)pcVar2;
    puVar5 = std::min<unsigned_long>(local_58 + 1,local_58);
    local_48 = *puVar5;
    pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&matchEnd,
                      pcVar1 + -local_48,local_48);
    distToStart._7_1_ = MatchWordBoundaryToRight(this,_matchEnd);
  }
  if ((bool)distToStart._7_1_ == false) {
    In_local._M_str._4_4_ = WORD_BOUNDARY_FAIL_START;
  }
  else {
    pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             data((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
    sVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
            size((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
    pcVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
            size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (pcVar1 + sVar3 == pcVar2 + sVar4) {
      distToStart._6_1_ = true;
    }
    else {
      pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      distToEnd = (unsigned_long)(pcVar1 + sVar3);
      local_80 = (char *)0x4;
      pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::data((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
      sVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&Match_local._M_str);
      local_88 = pcVar1 + (sVar3 - distToEnd);
      puVar5 = std::min<unsigned_long>((unsigned_long *)&local_80,(unsigned_long *)&local_88);
      local_78 = *puVar5;
      pcVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view(&local_98,pcVar1 + sVar3,local_78);
      distToStart._6_1_ = MatchWordBoundaryToLeft(this,local_98);
    }
    if ((bool)distToStart._6_1_ == false) {
      In_local._M_str._4_4_ = WORD_BOUNDARY_FAIL_END;
    }
    else {
      In_local._M_str._4_4_ = MATCH;
    }
  }
  return In_local._M_str._4_4_;
}

Assistant:

CM_RETURN_STATUS ConfusableMatcher::CheckWordBoundary(CMStringView In, CMStringView Match)
{
	bool startPass = false, endPass = false;

	if (In.data() == Match.data()) {
		// Check if it is at the beginning of In
		startPass = true;
	} else {
		// Check for word boundary char that is touching left of Match, thus matching from left to right
		auto distToStart = std::min((size_t)4 /* Max 4 chars of largest codepoint */, (size_t)(Match.data() - In.data()));
		startPass = ConfusableMatcher::MatchWordBoundaryToRight(CMStringView(Match.data() - distToStart, distToStart));
	}

	if (!startPass)
		return WORD_BOUNDARY_FAIL_START;

	if (In.data() + In.size() == Match.data() + Match.size()) {
		// Check if it is at the end of In
		endPass = true;
	} else {
		// Check for word boundary char that is touching right of Match, thus matching from right to left
		auto matchEnd = (size_t)(Match.data() + Match.size());
		auto distToEnd = std::min((size_t)4 /* Max 4 chars of largest codepoint */, (size_t)In.data() + In.size() - matchEnd);
		endPass = ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView(Match.data() + Match.size(), distToEnd));
	}

	if (!endPass)
		return WORD_BOUNDARY_FAIL_END;

	return MATCH;
}